

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# membrane.c++
# Opt level: O1

Promise<void> __thiscall
capnp::anon_unknown_0::MembraneCallContextHook::tailCall
          (MembraneCallContextHook *this,Own<capnp::RequestHook> *request)

{
  Disposer *pDVar1;
  Own<capnp::RequestHook> *in_RDX;
  PromiseNode *extraout_RDX;
  PromiseNode *extraout_RDX_00;
  PromiseNode *pPVar2;
  Promise<void> PVar3;
  RequestHook local_28;
  Disposer *local_20;
  
  pDVar1 = request[2].disposer;
  MembraneRequestHook::wrap
            ((MembraneRequestHook *)&stack0xffffffffffffffd8,in_RDX,
             (MembranePolicy *)request[3].disposer,(bool)(*(byte *)&request[3].ptr ^ 1));
  (*pDVar1->_vptr_Disposer[3])(this,pDVar1,&stack0xffffffffffffffd8);
  pDVar1 = local_20;
  pPVar2 = extraout_RDX;
  if (local_20 != (Disposer *)0x0) {
    local_20 = (Disposer *)0x0;
    (**(code **)*local_28._vptr_RequestHook)
              (local_28._vptr_RequestHook,pDVar1->_vptr_Disposer[-2] + (long)&pDVar1->_vptr_Disposer
              );
    pPVar2 = extraout_RDX_00;
  }
  PVar3.super_PromiseBase.node.ptr = pPVar2;
  PVar3.super_PromiseBase.node.disposer = (Disposer *)this;
  return (Promise<void>)PVar3.super_PromiseBase.node;
}

Assistant:

kj::Promise<void> tailCall(kj::Own<RequestHook>&& request) override {
    return inner->tailCall(MembraneRequestHook::wrap(kj::mv(request), *policy, !reverse));
  }